

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,BranchIf *b)

{
  size_t sVar1;
  CodePrinter *pCVar2;
  Block *b_00;
  Block *b_01;
  string local_40;
  
  choc::text::CodePrinter::operator<<(this->out,"branch_if ");
  printExpression(this,(b->condition).object);
  pCVar2 = choc::text::CodePrinter::operator<<(this->out," ? ");
  getBlockName_abi_cxx11_(&local_40,(PrinterStream *)b->targets[0].object,b_00);
  choc::text::CodePrinter::operator<<(pCVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  sVar1 = b->targetArgs[0].numActive;
  if (sVar1 != 0) {
    local_40._M_dataplus._M_p = (pointer)b->targetArgs[0].items;
    local_40._M_string_length = (long)local_40._M_dataplus._M_p + sVar1 * 8;
    printArgList(this,(ArrayView<soul::pool_ref<soul::heart::Expression>_> *)&local_40);
  }
  pCVar2 = choc::text::CodePrinter::operator<<(this->out," : ");
  getBlockName_abi_cxx11_(&local_40,(PrinterStream *)b->targets[1].object,b_01);
  choc::text::CodePrinter::operator<<(pCVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  sVar1 = b->targetArgs[1].numActive;
  if (sVar1 != 0) {
    local_40._M_dataplus._M_p = (pointer)b->targetArgs[1].items;
    local_40._M_string_length = (long)local_40._M_dataplus._M_p + sVar1 * 8;
    printArgList(this,(ArrayView<soul::pool_ref<soul::heart::Expression>_> *)&local_40);
  }
  return;
}

Assistant:

void printDescription (const heart::BranchIf& b)
        {
            out << "branch_if ";
            printExpression (b.condition);
            out << " ? " << getBlockName (b.targets[0]);

            if (! b.targetArgs[0].empty())
                printArgList (b.targetArgs[0]);

            out << " : " << getBlockName (b.targets[1]);

            if (! b.targetArgs[1].empty())
                printArgList (b.targetArgs[1]);
        }